

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_frameProgression *
ZSTD_getFrameProgression(ZSTD_frameProgression *__return_storage_ptr__,ZSTD_CCtx *cctx)

{
  ulong local_30;
  ZSTD_frameProgression *fp;
  size_t buffered;
  ZSTD_CCtx *cctx_local;
  
  if ((cctx->appliedParams).nbWorkers < 1) {
    if (cctx->inBuff == (char *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = cctx->inBuffPos - cctx->inToCompress;
    }
    if ((local_30 != 0) && (cctx->inBuffPos < cctx->inToCompress)) {
      __assert_fail("cctx->inBuffPos >= cctx->inToCompress",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2f0f,"ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx *)");
    }
    if (0x20000 < local_30) {
      __assert_fail("buffered <= ZSTD_BLOCKSIZE_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2f10,"ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx *)");
    }
    __return_storage_ptr__->ingested = cctx->consumedSrcSize + local_30;
    __return_storage_ptr__->consumed = cctx->consumedSrcSize;
    __return_storage_ptr__->produced = cctx->producedCSize;
    __return_storage_ptr__->flushed = cctx->producedCSize;
    __return_storage_ptr__->currentJobID = 0;
    __return_storage_ptr__->nbActiveWorkers = 0;
  }
  else {
    ZSTDMT_getFrameProgression(__return_storage_ptr__,cctx->mtctx);
  }
  return __return_storage_ptr__;
}

Assistant:

ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx* cctx)
{
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        return ZSTDMT_getFrameProgression(cctx->mtctx);
    }
#endif
    {   ZSTD_frameProgression fp;
        size_t const buffered = (cctx->inBuff == NULL) ? 0 :
                                cctx->inBuffPos - cctx->inToCompress;
        if (buffered) assert(cctx->inBuffPos >= cctx->inToCompress);
        assert(buffered <= ZSTD_BLOCKSIZE_MAX);
        fp.ingested = cctx->consumedSrcSize + buffered;
        fp.consumed = cctx->consumedSrcSize;
        fp.produced = cctx->producedCSize;
        fp.flushed  = cctx->producedCSize;   /* simplified; some data might still be left within streaming output buffer */
        fp.currentJobID = 0;
        fp.nbActiveWorkers = 0;
        return fp;
}   }